

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O1

void __thiscall Fifteen::slotLoadGraphic(Fifteen *this)

{
  int *piVar1;
  undefined8 uVar2;
  long lVar3;
  char cVar4;
  bool bVar5;
  QArrayData *pQVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QString file;
  QImage image;
  QArrayData *local_98 [2];
  undefined8 local_88;
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined8 local_70;
  QArrayData *local_68;
  undefined8 uStack_60;
  long local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  QArrayData *local_28;
  undefined8 local_20;
  long lStack_18;
  
  QVar7.m_data = (storage_type *)0x0;
  QVar7.m_size = (qsizetype)&local_80;
  QString::fromUtf8(QVar7);
  local_68 = (QArrayData *)CONCAT44(uStack_7c,local_80);
  uStack_60 = CONCAT44(uStack_74,uStack_78);
  local_58 = local_70;
  QVar8.m_data = (storage_type *)0x0;
  QVar8.m_size = (qsizetype)&local_80;
  QString::fromUtf8(QVar8);
  local_98[0] = (QArrayData *)CONCAT44(uStack_7c,local_80);
  local_88 = local_70;
  QDir::currentPath();
  QMetaObject::tr((char *)&local_48,(char *)&staticMetaObject,0x1174c4);
  QFileDialog::getOpenFileName(&local_28,this,local_98,&local_80,&local_48,0,0);
  lVar3 = local_58;
  uVar2 = uStack_60;
  pQVar6 = local_68;
  local_68 = local_28;
  local_28 = pQVar6;
  uStack_60 = local_20;
  local_58 = lStack_18;
  local_20 = uVar2;
  lStack_18 = lVar3;
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar6,2,8);
    }
  }
  piVar1 = (int *)CONCAT44(uStack_44,local_48);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_44,local_48),2,8);
    }
  }
  piVar1 = (int *)CONCAT44(uStack_7c,local_80);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_7c,local_80),2,8);
    }
  }
  if (local_98[0] != (QArrayData *)0x0) {
    LOCK();
    (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_98[0],2,8);
    }
  }
  if (local_58 == 0) goto LAB_0010b6a6;
  QImage::QImage((QImage *)&local_28);
  QImage::load((QString *)&local_28,(char *)&local_68);
  cVar4 = QImage::isNull();
  if (cVar4 == '\0') {
    bVar5 = Controller::loadGraphic
                      ((this->controller)._M_t.
                       super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                       super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                       super__Head_base<0UL,_Controller_*,_false>._M_head_impl,(QImage *)&local_28);
    if (bVar5) {
      MenuBar::setActionMenuState
                ((this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>.
                 _M_t.super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
                 super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl,REM_GRAPHIC,true);
    }
    QVar11.m_data = (storage_type *)0x0;
    QVar11.m_size = (qsizetype)&local_80;
    QString::fromUtf8(QVar11);
    local_98[0] = (QArrayData *)CONCAT44(uStack_7c,local_80);
    local_88 = local_70;
    Message::getMessages();
    QMessageBox::information(this,local_98,&local_80,0x400,0);
    piVar1 = (int *)CONCAT44(uStack_7c,local_80);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pQVar6 = (QArrayData *)CONCAT44(uStack_7c,local_80);
        goto LAB_0010b667;
      }
    }
  }
  else {
    QVar9.m_data = (storage_type *)0x0;
    QVar9.m_size = (qsizetype)&local_80;
    QString::fromUtf8(QVar9);
    local_98[0] = (QArrayData *)CONCAT44(uStack_7c,local_80);
    local_88 = local_70;
    QVar10.m_data = (storage_type *)0x1c;
    QVar10.m_size = (qsizetype)&local_80;
    QString::fromUtf8(QVar10);
    local_48 = local_80;
    uStack_44 = uStack_7c;
    uStack_40 = uStack_78;
    uStack_3c = uStack_74;
    local_38 = local_70;
    QMessageBox::information(this,local_98,&local_48,0x400,0);
    piVar1 = (int *)CONCAT44(uStack_44,local_48);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pQVar6 = (QArrayData *)CONCAT44(uStack_44,local_48);
LAB_0010b667:
        QArrayData::deallocate(pQVar6,2,8);
      }
    }
  }
  if (local_98[0] != (QArrayData *)0x0) {
    LOCK();
    (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_98[0],2,8);
    }
  }
  QImage::~QImage((QImage *)&local_28);
LAB_0010b6a6:
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  return;
}

Assistant:

void Fifteen::slotLoadGraphic()
{
    QString file = nullptr;
    if ( file = QFileDialog::getOpenFileName( this, "", QDir::currentPath(), tr( "JPG, PNG, GIF, BMP (*.jpg *.png *.gif *.bmp)" ));
         file.isEmpty())
    {
        return;
    }

    QImage image;
    if ( image.load( file ); image.isNull() )
    {
        QMessageBox::information( this, "", "Failure of loading an image\t" );
        return;
    }

    if ( controller->loadGraphic( image ))
    {
        menuBar->setActionMenuState( ActionMenu::REM_GRAPHIC, true );
    }
    QMessageBox::information( this, "", Message::getMessages() );
}